

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_vec2 nk_text_calculate_text_bounds
                  (nk_user_font *font,char *begin,int byte_len,float row_height,char **remaining,
                  nk_vec2 *out_offset,int *glyphs,int op)

{
  long lVar1;
  nk_vec2 nVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  nk_vec2 nVar11;
  undefined4 in_XMM0_Db;
  float fVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  nk_rune unicode;
  nk_rune local_ac;
  char *local_a8;
  float local_9c;
  int *local_98;
  nk_vec2 *local_90;
  char **local_88;
  char *local_80;
  int local_74;
  ulong local_70;
  float local_68;
  undefined4 uStack_64;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  nk_handle *local_48;
  char *local_40;
  ulong local_38;
  
  local_ac = 0;
  if (((font == (nk_user_font *)0x0) || (begin == (char *)0x0)) || (byte_len < 1)) {
    nVar11 = (nk_vec2)((ulong)(uint)row_height << 0x20);
  }
  else {
    local_98 = glyphs;
    local_68 = row_height;
    uStack_64 = in_XMM0_Db;
    iVar4 = nk_utf_decode(begin,&local_ac,byte_len);
    if (iVar4 == 0) {
      nVar11.x = 0.0;
      nVar11.y = 0.0;
    }
    else {
      local_90 = out_offset;
      local_88 = remaining;
      local_48 = &font->userdata;
      local_9c = (*font->width)(font->userdata,font->height,begin,iVar4);
      *local_98 = 0;
      local_40 = begin + 1;
      local_58 = 0.0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uVar7 = 0;
      local_80 = begin;
      local_74 = byte_len;
      local_38 = (ulong)(uint)byte_len;
      do {
        pcVar3 = local_40;
        iVar5 = (int)uVar7;
        local_70 = (ulong)(uint)(local_74 - iVar5);
        iVar9 = -1;
        lVar10 = 0;
        local_a8 = (char *)uVar7;
        while (pcVar8 = local_80, local_ac == 0xd) {
          *local_98 = *local_98 + 1;
          lVar1 = (long)iVar5 + 1 + lVar10;
          iVar4 = nk_utf_decode(pcVar3 + lVar10 + iVar5,&local_ac,(int)local_70 + iVar9);
          lVar10 = lVar10 + 1;
          if (((long)local_38 <= lVar1) || (iVar9 = iVar9 + -1, iVar4 == 0)) {
            iVar5 = (int)local_a8 + (int)lVar10;
            auVar12 = ZEXT816(0);
            pcVar8 = local_80;
            goto LAB_00147ac9;
          }
        }
        iVar9 = (int)lVar10;
        if (local_ac == 10) {
          iVar5 = (int)local_a8 + iVar9;
          if (local_58 <= 0.0) {
            local_58 = 0.0;
          }
          *local_98 = *local_98 + 1;
          auVar12._4_4_ = local_68 + 0.0;
          auVar12._0_4_ = local_58;
          auVar12._8_4_ = uStack_54;
          auVar12._12_4_ = uStack_64;
          local_58 = 0.0;
          goto LAB_00147ac9;
        }
        *local_98 = *local_98 + 1;
        iVar5 = (int)local_a8 + iVar4;
        uVar6 = iVar5 + iVar9;
        uVar7 = (ulong)uVar6;
        local_58 = local_58 + local_9c;
        local_a8 = local_80 + (int)uVar6;
        iVar4 = nk_utf_decode(local_a8,&local_ac,((int)local_70 - iVar4) - iVar9);
        local_9c = (*(code *)local_48[2])(*local_48,(float)local_48[1].id,local_a8,iVar4);
      } while (((int)uVar6 < local_74) && (iVar4 != 0));
      iVar5 = iVar5 + iVar9;
      auVar12 = ZEXT416(0);
LAB_00147ac9:
      nVar11 = auVar12._0_8_;
      if (auVar12._0_4_ < local_58) {
        auVar13._4_12_ = auVar12._4_12_;
        auVar13._0_4_ = local_58;
        nVar11 = auVar13._0_8_;
      }
      fVar14 = nVar11.y;
      if (local_90 != (nk_vec2 *)0x0) {
        nVar2.y = fVar14 + local_68;
        nVar2.x = local_58;
        *local_90 = nVar2;
      }
      if (fVar14 == 0.0 || 0.0 < local_58) {
        nVar11.y = fVar14 + local_68;
      }
      if (local_88 != (char **)0x0) {
        *local_88 = pcVar8 + iVar5;
      }
    }
  }
  return nVar11;
}

Assistant:

NK_LIB struct nk_vec2
nk_text_calculate_text_bounds(const struct nk_user_font *font,
    const char *begin, int byte_len, float row_height, const char **remaining,
    struct nk_vec2 *out_offset, int *glyphs, int op)
{
    float line_height = row_height;
    struct nk_vec2 text_size = nk_vec2(0,0);
    float line_width = 0.0f;

    float glyph_width;
    int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    if (!begin || byte_len <= 0 || !font)
        return nk_vec2(0,row_height);

    glyph_len = nk_utf_decode(begin, &unicode, byte_len);
    if (!glyph_len) return text_size;
    glyph_width = font->width(font->userdata, font->height, begin, glyph_len);

    *glyphs = 0;
    while ((text_len < byte_len) && glyph_len) {
        if (unicode == '\n') {
            text_size.x = NK_MAX(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0;
            *glyphs+=1;
            if (op == NK_STOP_ON_NEW_LINE)
                break;

            text_len++;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        if (unicode == '\r') {
            text_len++;
            *glyphs+=1;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        *glyphs = *glyphs + 1;
        text_len += glyph_len;
        line_width += (float)glyph_width;
        glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
        glyph_width = font->width(font->userdata, font->height, begin+text_len, glyph_len);
        continue;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;
    if (out_offset)
        *out_offset = nk_vec2(line_width, text_size.y + line_height);
    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;
    if (remaining)
        *remaining = begin+text_len;
    return text_size;
}